

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void __thiscall
TPZFrontNonSym<std::complex<float>_>::AddKel
          (TPZFrontNonSym<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *destinationindex)

{
  int iVar1;
  complex<float> *this_00;
  TPZFMatrix<std::complex<float>_> *this_01;
  TPZFrontNonSym<std::complex<float>_> *this_02;
  TPZVec<long> *in_RDX;
  complex<float> *in_RDI;
  int64_t nel;
  int64_t jlocal;
  int64_t ilocal;
  int64_t j;
  int64_t i;
  int64_t in_stack_ffffffffffffffa8;
  TPZFrontNonSym<std::complex<float>_> *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_20;
  
  this_00 = (complex<float> *)TPZVec<long>::NElements(in_RDX);
  for (local_20 = 0; local_20 < (long)this_00; local_20 = local_20 + 1) {
    TPZVec<long>::operator[](in_RDX,local_20);
    iVar1 = Local(in_stack_ffffffffffffffc8,(int64_t)this_00);
    this_01 = (TPZFMatrix<std::complex<float>_> *)(long)iVar1;
    for (local_28 = 0; local_28 < (long)this_00; local_28 = local_28 + 1) {
      TPZVec<long>::operator[](in_RDX,local_28);
      iVar1 = Local(in_stack_ffffffffffffffc8,(int64_t)this_00);
      in_stack_ffffffffffffffc8 = (TPZFrontNonSym<std::complex<float>_> *)(long)iVar1;
      this_02 = (TPZFrontNonSym<std::complex<float>_> *)
                TPZFMatrix<std::complex<float>_>::operator()
                          (this_01,(int64_t)in_stack_ffffffffffffffc8,(int64_t)this_00);
      Element(this_02,in_stack_ffffffffffffffa8,0x1d1ed0d);
      std::complex<float>::operator+=(this_00,in_RDI);
    }
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
    int64_t i, j, ilocal, jlocal, nel;
    nel = destinationindex.NElements();
    for(i=0;i<nel;i++){
        ilocal = this->Local(destinationindex[i]);
		for(j=0;j<nel;j++) {
            jlocal=this->Local(destinationindex[j]);
            this->Element(ilocal, jlocal)+=elmat(i,j);
        }
    }
}